

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O0

vector<LongReadMapping,_std::allocator<LongReadMapping>_> * __thiscall
LongReadsMapper::filter_and_chain_matches_by_offset_group
          (LongReadsMapper *this,vector<LongReadMapping,_std::allocator<LongReadMapping>_> *matches,
          bool verbose)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  reference pvVar4;
  undefined4 extraout_var;
  size_type sVar5;
  ulong uVar6;
  reference pvVar7;
  int *piVar8;
  void *pvVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  byte in_CL;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *in_RDX;
  char *pcVar10;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *in_RDI;
  reference rVar11;
  LongReadMapping *m_8;
  iterator __end2_5;
  iterator __begin2_5;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *__range2_5;
  LongReadMapping *m_7;
  iterator __end2_4;
  iterator __begin2_4;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *__range2_4;
  LongReadMapping chained;
  match_band *mb;
  iterator __end1_2;
  iterator __begin1_2;
  vector<match_band,_std::allocator<match_band>_> *__range1_2;
  match_band *m_6;
  iterator __end2_3;
  iterator __begin2_3;
  vector<match_band,_std::allocator<match_band>_> *__range2_3;
  int32_t max_score;
  vector<match_band,_std::allocator<match_band>_> filtered_mbo;
  match_band *m_5;
  iterator __end2_2;
  iterator __begin2_2;
  vector<match_band,_std::allocator<match_band>_> *__range2_2;
  value_type m2;
  int mi2;
  value_type m_4;
  int mi;
  vector<match_band,_std::allocator<match_band>_> new_mbo;
  vector<bool,_std::allocator<bool>_> used;
  size_type prev_len;
  match_band *m_3;
  iterator __end2_1;
  iterator __begin2_1;
  vector<match_band,_std::allocator<match_band>_> *__range2_1;
  int maxo;
  int mino;
  match_band *m_2;
  iterator __end1_1;
  iterator __begin1_1;
  vector<match_band,_std::allocator<match_band>_> *__range1_1;
  LongReadMapping *m_1;
  iterator __end1;
  iterator __begin1;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *__range1;
  long node;
  vector<match_band,_std::allocator<match_band>_> mbo;
  LongReadMapping *m;
  iterator __end2;
  iterator __begin2;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *__range2;
  int32_t OFFSET_BANDWITDH;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *filtered_matches;
  LongReadMapping *in_stack_fffffffffffffb58;
  ostream *in_stack_fffffffffffffb60;
  back_insert_iterator<std::vector<match_band,_std::allocator<match_band>_>_>
  in_stack_fffffffffffffb68;
  __normal_iterator<match_band_*,_std::vector<match_band,_std::allocator<match_band>_>_>
  in_stack_fffffffffffffb70;
  __normal_iterator<match_band_*,_std::vector<match_band,_std::allocator<match_band>_>_>
  in_stack_fffffffffffffb78;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffb80;
  bool *in_stack_fffffffffffffb88;
  vector<match_band,_std::allocator<match_band>_> *in_stack_fffffffffffffb90;
  vector<match_band,_std::allocator<match_band>_> *in_stack_fffffffffffffbf8;
  vector<match_band,_std::allocator<match_band>_> *in_stack_fffffffffffffc00;
  __normal_iterator<LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
  local_2c8 [2];
  reference local_2b8;
  LongReadMapping *local_2b0;
  __normal_iterator<LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
  local_2a8;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *local_2a0;
  LongReadMapping local_298;
  reference local_278;
  match_band *local_270;
  __normal_iterator<match_band_*,_std::vector<match_band,_std::allocator<match_band>_>_> local_268;
  undefined1 *local_260;
  undefined1 local_251;
  reference local_250;
  match_band *local_248;
  __normal_iterator<match_band_*,_std::vector<match_band,_std::allocator<match_band>_>_> local_240;
  undefined1 *local_238;
  vector<match_band,_std::allocator<match_band>_> *local_230;
  int32_t local_224;
  vector<match_band,_std::allocator<match_band>_> *local_220;
  match_band *local_218;
  match_band *local_210;
  int32_t local_204;
  undefined1 local_200 [24];
  reference local_1e8;
  match_band *local_1e0;
  __normal_iterator<match_band_*,_std::vector<match_band,_std::allocator<match_band>_>_> local_1d8;
  vector<match_band,_std::allocator<match_band>_> *local_1d0;
  match_band *local_1c0;
  match_band *local_1b8;
  reference local_1b0;
  undefined8 local_19c;
  undefined8 local_194;
  int32_t local_18c;
  reference local_188;
  int local_178;
  undefined8 local_174;
  undefined8 local_16c;
  int local_164;
  reference local_160;
  reference local_150;
  int local_13c;
  undefined1 local_119;
  size_type local_f0;
  reference local_e8;
  match_band *local_e0;
  __normal_iterator<match_band_*,_std::vector<match_band,_std::allocator<match_band>_>_> local_d8;
  vector<match_band,_std::allocator<match_band>_> *local_d0;
  int local_c8;
  int local_c4;
  reference local_c0;
  match_band *local_b8;
  __normal_iterator<match_band_*,_std::vector<match_band,_std::allocator<match_band>_>_> local_b0;
  vector<match_band,_std::allocator<match_band>_> *local_a8;
  int local_a0;
  int local_9c;
  int local_98;
  undefined1 local_91;
  reference local_90;
  LongReadMapping *local_88;
  __normal_iterator<LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
  local_80;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *local_78;
  long local_60;
  vector<match_band,_std::allocator<match_band>_> local_58;
  reference local_40;
  LongReadMapping *local_38;
  __normal_iterator<LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
  local_30;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *local_28;
  undefined4 local_20;
  byte local_19;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *local_18;
  
  local_19 = in_CL & 1;
  local_20 = 200;
  local_18 = in_RDX;
  if (local_19 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Filtering matches:");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_28 = local_18;
    local_30._M_current =
         (LongReadMapping *)
         std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::begin
                   (in_stack_fffffffffffffb58);
    local_38 = (LongReadMapping *)
               std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::end
                         ((vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)
                          in_stack_fffffffffffffb58);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
                               *)in_stack_fffffffffffffb60,
                              (__normal_iterator<LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
                               *)in_stack_fffffffffffffb58), bVar1) {
      local_40 = __gnu_cxx::
                 __normal_iterator<LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
                 ::operator*(&local_30);
      poVar3 = ::operator<<(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      __gnu_cxx::
      __normal_iterator<LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
      ::operator++(&local_30);
    }
  }
  std::vector<match_band,_std::allocator<match_band>_>::vector
            ((vector<match_band,_std::allocator<match_band>_> *)0x3f6723);
  pvVar4 = std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::operator[](local_18,0);
  iVar2 = std::abs((int)pvVar4->node);
  local_60 = CONCAT44(extraout_var,iVar2);
  local_78 = local_18;
  local_80._M_current =
       (LongReadMapping *)
       std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::begin
                 (in_stack_fffffffffffffb58);
  local_88 = (LongReadMapping *)
             std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::end
                       ((vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)
                        in_stack_fffffffffffffb58);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
                             *)in_stack_fffffffffffffb60,
                            (__normal_iterator<LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
                             *)in_stack_fffffffffffffb58), bVar1) {
    local_90 = __gnu_cxx::
               __normal_iterator<LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
               ::operator*(&local_80);
    local_91 = local_60 == local_90->node;
    local_98 = local_90->qStart - local_90->nStart;
    local_9c = local_90->qEnd - local_90->nEnd;
    local_a0 = local_90->nEnd - local_90->nStart;
    std::vector<match_band,std::allocator<match_band>>::emplace_back<bool,int,int,int,int_const&>
              (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,(int *)in_stack_fffffffffffffb80,
               (int *)in_stack_fffffffffffffb78._M_current,
               (int *)in_stack_fffffffffffffb70._M_current,
               (int *)in_stack_fffffffffffffb68.container);
    __gnu_cxx::
    __normal_iterator<LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
    ::operator++(&local_80);
  }
  local_a8 = &local_58;
  local_b0._M_current =
       (match_band *)
       std::vector<match_band,_std::allocator<match_band>_>::begin
                 ((vector<match_band,_std::allocator<match_band>_> *)in_stack_fffffffffffffb58);
  local_b8 = (match_band *)
             std::vector<match_band,_std::allocator<match_band>_>::end
                       ((vector<match_band,_std::allocator<match_band>_> *)in_stack_fffffffffffffb58
                       );
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<match_band_*,_std::vector<match_band,_std::allocator<match_band>_>_>
                             *)in_stack_fffffffffffffb60,
                            (__normal_iterator<match_band_*,_std::vector<match_band,_std::allocator<match_band>_>_>
                             *)in_stack_fffffffffffffb58), bVar1) {
    local_c0 = __gnu_cxx::
               __normal_iterator<match_band_*,_std::vector<match_band,_std::allocator<match_band>_>_>
               ::operator*(&local_b0);
    piVar8 = std::min<int>(&local_c0->min_offset,&local_c0->max_offset);
    local_c4 = *piVar8 + -200;
    piVar8 = std::max<int>(&local_c0->min_offset,&local_c0->max_offset);
    local_c8 = *piVar8 + 200;
    local_c0->min_offset = local_c4;
    local_c0->max_offset = local_c8;
    __gnu_cxx::
    __normal_iterator<match_band_*,_std::vector<match_band,_std::allocator<match_band>_>_>::
    operator++(&local_b0);
  }
  if ((local_19 & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Orientations, offsets, lengths and scores:");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_d0 = &local_58;
    local_d8._M_current =
         (match_band *)
         std::vector<match_band,_std::allocator<match_band>_>::begin
                   ((vector<match_band,_std::allocator<match_band>_> *)in_stack_fffffffffffffb58);
    local_e0 = (match_band *)
               std::vector<match_band,_std::allocator<match_band>_>::end
                         ((vector<match_band,_std::allocator<match_band>_> *)
                          in_stack_fffffffffffffb58);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<match_band_*,_std::vector<match_band,_std::allocator<match_band>_>_>
                               *)in_stack_fffffffffffffb60,
                              (__normal_iterator<match_band_*,_std::vector<match_band,_std::allocator<match_band>_>_>
                               *)in_stack_fffffffffffffb58), bVar1) {
      local_e8 = __gnu_cxx::
                 __normal_iterator<match_band_*,_std::vector<match_band,_std::allocator<match_band>_>_>
                 ::operator*(&local_d8);
      pcVar10 = "false";
      if ((local_e8->dir & 1U) != 0) {
        pcVar10 = "true";
      }
      poVar3 = std::operator<<((ostream *)&std::cout,pcVar10);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_e8->min_offset);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_e8->max_offset);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_e8->len);
      poVar3 = std::operator<<(poVar3,", ");
      pvVar9 = (void *)std::ostream::operator<<(poVar3,local_e8->score);
      std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
      __gnu_cxx::
      __normal_iterator<match_band_*,_std::vector<match_band,_std::allocator<match_band>_>_>::
      operator++(&local_d8);
    }
  }
  local_f0 = std::vector<match_band,_std::allocator<match_band>_>::size(&local_58);
  local_f0 = local_f0 + 1;
  while( true ) {
    sVar5 = std::vector<match_band,_std::allocator<match_band>_>::size(&local_58);
    if (local_f0 <= sVar5) break;
    std::vector<match_band,_std::allocator<match_band>_>::size(&local_58);
    local_119 = 0;
    std::allocator<bool>::allocator((allocator<bool> *)0x3f6c16);
    std::vector<bool,_std::allocator<bool>_>::vector
              (in_stack_fffffffffffffb80,(size_type)in_stack_fffffffffffffb78._M_current,
               &(in_stack_fffffffffffffb70._M_current)->dir,
               (allocator_type *)in_stack_fffffffffffffb68.container);
    std::allocator<bool>::~allocator((allocator<bool> *)0x3f6c4a);
    std::vector<match_band,_std::allocator<match_band>_>::vector
              ((vector<match_band,_std::allocator<match_band>_> *)0x3f6c57);
    local_13c = 0;
    while( true ) {
      uVar6 = (ulong)local_13c;
      sVar5 = std::vector<match_band,_std::allocator<match_band>_>::size(&local_58);
      if (sVar5 <= uVar6) break;
      rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (in_stack_fffffffffffffb80,(size_type)in_stack_fffffffffffffb78._M_current)
      ;
      local_150 = rVar11;
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_150);
      if (!bVar1) {
        rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (in_stack_fffffffffffffb80,
                            (size_type)in_stack_fffffffffffffb78._M_current);
        local_160 = rVar11;
        std::_Bit_reference::operator=(&local_160,true);
        pvVar7 = std::vector<match_band,_std::allocator<match_band>_>::operator[]
                           (&local_58,(long)local_13c);
        local_174._0_1_ = pvVar7->dir;
        local_174._1_3_ = *(undefined3 *)&pvVar7->field_0x1;
        local_174._4_4_ = pvVar7->min_offset;
        local_16c._0_4_ = pvVar7->max_offset;
        local_16c._4_4_ = pvVar7->len;
        local_164 = pvVar7->score;
        local_178 = 0;
        while( true ) {
          uVar6 = (ulong)local_178;
          sVar5 = std::vector<match_band,_std::allocator<match_band>_>::size(&local_58);
          if (sVar5 <= uVar6) break;
          rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (in_stack_fffffffffffffb80,
                              (size_type)in_stack_fffffffffffffb78._M_current);
          local_188 = rVar11;
          bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_188);
          if (!bVar1) {
            pvVar7 = std::vector<match_band,_std::allocator<match_band>_>::operator[]
                               (&local_58,(long)local_178);
            local_19c._0_1_ = pvVar7->dir;
            local_19c._1_3_ = *(undefined3 *)&pvVar7->field_0x1;
            local_19c._4_4_ = pvVar7->min_offset;
            local_194._0_4_ = pvVar7->max_offset;
            local_194._4_4_ = pvVar7->len;
            local_18c = pvVar7->score;
            if (local_174._4_4_ < (int)(undefined4)local_194) {
              if ((int)local_19c._4_4_ < (int)local_16c) {
                piVar8 = std::min<int>((int *)((long)&local_174 + 4),(int *)((long)&local_19c + 4));
                local_174 = CONCAT44(*piVar8,(undefined4)local_174);
                piVar8 = std::max<int>((int *)&local_16c,(int *)&local_194);
                local_16c = CONCAT44(local_16c._4_4_ + local_194._4_4_,*piVar8);
                local_164 = local_164 + local_18c;
                rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                   (in_stack_fffffffffffffb80,
                                    (size_type)in_stack_fffffffffffffb78._M_current);
                local_1b0 = rVar11;
                std::_Bit_reference::operator=(&local_1b0,true);
              }
            }
          }
          local_178 = local_178 + 1;
        }
        std::vector<match_band,std::allocator<match_band>>::emplace_back<match_band&>
                  ((vector<match_band,_std::allocator<match_band>_> *)
                   in_stack_fffffffffffffb70._M_current,
                   (match_band *)in_stack_fffffffffffffb68.container);
      }
      local_13c = local_13c + 1;
    }
    local_f0 = std::vector<match_band,_std::allocator<match_band>_>::size(&local_58);
    std::vector<match_band,_std::allocator<match_band>_>::operator=
              (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
    std::vector<match_band,_std::allocator<match_band>_>::~vector
              ((vector<match_band,_std::allocator<match_band>_> *)
               in_stack_fffffffffffffb70._M_current);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x3f704f);
  }
  local_1b8 = (match_band *)
              std::vector<match_band,_std::allocator<match_band>_>::begin
                        ((vector<match_band,_std::allocator<match_band>_> *)
                         in_stack_fffffffffffffb58);
  local_1c0 = (match_band *)
              std::vector<match_band,_std::allocator<match_band>_>::end
                        ((vector<match_band,_std::allocator<match_band>_> *)
                         in_stack_fffffffffffffb58);
  std::
  sort<__gnu_cxx::__normal_iterator<match_band*,std::vector<match_band,std::allocator<match_band>>>,LongReadsMapper::filter_and_chain_matches_by_offset_group(std::vector<LongReadMapping,std::allocator<LongReadMapping>>&,bool)const::__0>
            (local_1b8,local_1c0);
  if ((local_19 & 1) != 0) {
    std::operator<<((ostream *)&std::cout,
                    "Consolidated orientations, offsets, lengths and scores:\n");
    local_1d0 = &local_58;
    local_1d8._M_current =
         (match_band *)
         std::vector<match_band,_std::allocator<match_band>_>::begin
                   ((vector<match_band,_std::allocator<match_band>_> *)in_stack_fffffffffffffb58);
    local_1e0 = (match_band *)
                std::vector<match_band,_std::allocator<match_band>_>::end
                          ((vector<match_band,_std::allocator<match_band>_> *)
                           in_stack_fffffffffffffb58);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<match_band_*,_std::vector<match_band,_std::allocator<match_band>_>_>
                          *)in_stack_fffffffffffffb60,
                         (__normal_iterator<match_band_*,_std::vector<match_band,_std::allocator<match_band>_>_>
                          *)in_stack_fffffffffffffb58);
      if (!bVar1) break;
      local_1e8 = __gnu_cxx::
                  __normal_iterator<match_band_*,_std::vector<match_band,_std::allocator<match_band>_>_>
                  ::operator*(&local_1d8);
      pcVar10 = "false";
      if ((local_1e8->dir & 1U) != 0) {
        pcVar10 = "true";
      }
      poVar3 = std::operator<<((ostream *)&std::cout,pcVar10);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1e8->min_offset);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1e8->max_offset);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1e8->len);
      poVar3 = std::operator<<(poVar3,", ");
      pvVar9 = (void *)std::ostream::operator<<(poVar3,local_1e8->score);
      std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
      __gnu_cxx::
      __normal_iterator<match_band_*,_std::vector<match_band,_std::allocator<match_band>_>_>::
      operator++(&local_1d8);
    }
  }
  std::vector<match_band,_std::allocator<match_band>_>::vector
            ((vector<match_band,_std::allocator<match_band>_> *)0x3f72a3);
  pvVar7 = std::vector<match_band,_std::allocator<match_band>_>::operator[](&local_58,0);
  local_204 = pvVar7->score;
  local_210 = (match_band *)
              std::vector<match_band,_std::allocator<match_band>_>::begin
                        ((vector<match_band,_std::allocator<match_band>_> *)
                         in_stack_fffffffffffffb58);
  local_218 = (match_band *)
              std::vector<match_band,_std::allocator<match_band>_>::end
                        ((vector<match_band,_std::allocator<match_band>_> *)
                         in_stack_fffffffffffffb58);
  local_220 = (vector<match_band,_std::allocator<match_band>_> *)
              std::back_inserter<std::vector<match_band,std::allocator<match_band>>>
                        ((vector<match_band,_std::allocator<match_band>_> *)
                         in_stack_fffffffffffffb58);
  local_224 = local_204;
  local_230 = (vector<match_band,_std::allocator<match_band>_> *)
              std::
              copy_if<__gnu_cxx::__normal_iterator<match_band*,std::vector<match_band,std::allocator<match_band>>>,std::back_insert_iterator<std::vector<match_band,std::allocator<match_band>>>,LongReadsMapper::filter_and_chain_matches_by_offset_group(std::vector<LongReadMapping,std::allocator<LongReadMapping>>&,bool)const::__1>
                        (in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,
                         in_stack_fffffffffffffb68,
                         (anon_class_4_1_07993297)
                         (int32_t)((ulong)in_stack_fffffffffffffb60 >> 0x20));
  if ((local_19 & 1) != 0) {
    std::operator<<((ostream *)&std::cout,"Filtered orientations, offsets, lengths and scores:\n");
    local_238 = local_200;
    local_240._M_current =
         (match_band *)
         std::vector<match_band,_std::allocator<match_band>_>::begin
                   ((vector<match_band,_std::allocator<match_band>_> *)in_stack_fffffffffffffb58);
    local_248 = (match_band *)
                std::vector<match_band,_std::allocator<match_band>_>::end
                          ((vector<match_band,_std::allocator<match_band>_> *)
                           in_stack_fffffffffffffb58);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<match_band_*,_std::vector<match_band,_std::allocator<match_band>_>_>
                          *)in_stack_fffffffffffffb60,
                         (__normal_iterator<match_band_*,_std::vector<match_band,_std::allocator<match_band>_>_>
                          *)in_stack_fffffffffffffb58);
      if (!bVar1) break;
      local_250 = __gnu_cxx::
                  __normal_iterator<match_band_*,_std::vector<match_band,_std::allocator<match_band>_>_>
                  ::operator*(&local_240);
      pcVar10 = "false";
      if ((local_250->dir & 1U) != 0) {
        pcVar10 = "true";
      }
      poVar3 = std::operator<<((ostream *)&std::cout,pcVar10);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_250->min_offset);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_250->max_offset);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_250->len);
      poVar3 = std::operator<<(poVar3,", ");
      pvVar9 = (void *)std::ostream::operator<<(poVar3,local_250->score);
      std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
      __gnu_cxx::
      __normal_iterator<match_band_*,_std::vector<match_band,_std::allocator<match_band>_>_>::
      operator++(&local_240);
    }
  }
  local_251 = 0;
  std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::vector
            ((vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)0x3f753d);
  local_260 = local_200;
  local_268._M_current =
       (match_band *)
       std::vector<match_band,_std::allocator<match_band>_>::begin
                 ((vector<match_band,_std::allocator<match_band>_> *)in_stack_fffffffffffffb58);
  local_270 = (match_band *)
              std::vector<match_band,_std::allocator<match_band>_>::end
                        ((vector<match_band,_std::allocator<match_band>_> *)
                         in_stack_fffffffffffffb58);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<match_band_*,_std::vector<match_band,_std::allocator<match_band>_>_>
                        *)in_stack_fffffffffffffb60,
                       (__normal_iterator<match_band_*,_std::vector<match_band,_std::allocator<match_band>_>_>
                        *)in_stack_fffffffffffffb58);
    if (!bVar1) break;
    local_278 = __gnu_cxx::
                __normal_iterator<match_band_*,_std::vector<match_band,_std::allocator<match_band>_>_>
                ::operator*(&local_268);
    LongReadMapping::LongReadMapping(&local_298);
    local_298.nStart = 0x7fffffff;
    local_298.nEnd = -0x80000000;
    local_298.score = 0;
    pvVar4 = std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::operator[](local_18,0);
    local_298.read_id = pvVar4->read_id;
    if ((local_278->dir & 1U) == 0) {
      pvVar4 = std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::operator[]
                         (local_18,0);
      iVar2 = std::abs((int)pvVar4->node);
      in_stack_fffffffffffffb68.container =
           (vector<match_band,_std::allocator<match_band>_> *)CONCAT44(extraout_var_01,iVar2);
      in_stack_fffffffffffffb70._M_current =
           (match_band *)-(long)in_stack_fffffffffffffb68.container;
    }
    else {
      pvVar4 = std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::operator[]
                         (local_18,0);
      iVar2 = std::abs((int)pvVar4->node);
      in_stack_fffffffffffffb70._M_current = (match_band *)CONCAT44(extraout_var_00,iVar2);
    }
    local_2a0 = local_18;
    local_298.node = (sgNodeID_t)in_stack_fffffffffffffb70._M_current;
    local_2a8._M_current =
         (LongReadMapping *)
         std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::begin
                   (in_stack_fffffffffffffb58);
    local_2b0 = (LongReadMapping *)
                std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::end
                          ((vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)
                           in_stack_fffffffffffffb58);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
                          *)in_stack_fffffffffffffb60,
                         (__normal_iterator<LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
                          *)in_stack_fffffffffffffb58);
      if (!bVar1) break;
      local_2b8 = __gnu_cxx::
                  __normal_iterator<LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
                  ::operator*(&local_2a8);
      if ((local_278->min_offset <= local_2b8->qStart - local_2b8->nStart) &&
         (local_2b8->qEnd - local_2b8->nEnd <= local_278->max_offset)) {
        if (local_2b8->nStart < local_298.nStart) {
          local_298.nStart = local_2b8->nStart;
          local_298.qStart = local_2b8->qStart;
        }
        if (local_298.nEnd < local_2b8->nEnd) {
          local_298.nEnd = local_2b8->nEnd;
          local_298.qEnd = local_2b8->qEnd;
        }
        local_298.score = local_2b8->score + local_298.score;
      }
      __gnu_cxx::
      __normal_iterator<LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
      ::operator++(&local_2a8);
    }
    std::vector<LongReadMapping,std::allocator<LongReadMapping>>::emplace_back<LongReadMapping&>
              ((vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)
               in_stack_fffffffffffffb70._M_current,
               (LongReadMapping *)in_stack_fffffffffffffb68.container);
    __gnu_cxx::
    __normal_iterator<match_band_*,_std::vector<match_band,_std::allocator<match_band>_>_>::
    operator++(&local_268);
  }
  if ((local_19 & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Filtered matches:");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_2c8[0]._M_current =
         (LongReadMapping *)
         std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::begin
                   (in_stack_fffffffffffffb58);
    std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::end
              ((vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)
               in_stack_fffffffffffffb58);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
                          *)poVar3,
                         (__normal_iterator<LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
                          *)in_stack_fffffffffffffb58);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
      ::operator*(local_2c8);
      in_stack_fffffffffffffb58 = (LongReadMapping *)::operator<<(poVar3,in_stack_fffffffffffffb58);
      std::ostream::operator<<(in_stack_fffffffffffffb58,std::endl<char,std::char_traits<char>>);
      __gnu_cxx::
      __normal_iterator<LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
      ::operator++(local_2c8);
    }
  }
  local_251 = 1;
  std::vector<match_band,_std::allocator<match_band>_>::~vector
            ((vector<match_band,_std::allocator<match_band>_> *)in_stack_fffffffffffffb70._M_current
            );
  std::vector<match_band,_std::allocator<match_band>_>::~vector
            ((vector<match_band,_std::allocator<match_band>_> *)in_stack_fffffffffffffb70._M_current
            );
  return in_RDI;
}

Assistant:

std::vector<LongReadMapping>
LongReadsMapper::filter_and_chain_matches_by_offset_group(std::vector<LongReadMapping> &matches, bool verbose) const {

    const int32_t OFFSET_BANDWITDH=200;
    if (verbose){
        std::cout<<"Filtering matches:" << std::endl;
        for (const auto &m : matches)
            std::cout << m << std::endl;
    }


    std::vector<match_band> mbo;
    auto node = std::abs(matches[0].node);
    for (const auto &m : matches ){
        mbo.emplace_back(node == m.node, m.qStart-m.nStart, m.qEnd-m.nEnd, m.nEnd-m.nStart, m.score);
    }

    for (auto &m : mbo) {
        auto mino=std::min(m.min_offset,m.max_offset)-OFFSET_BANDWITDH;
        auto maxo=std::max(m.min_offset, m.max_offset)+OFFSET_BANDWITDH;
        m.min_offset = mino;
        m.max_offset = maxo;
    }

    if (verbose){
        std::cout << "Orientations, offsets, lengths and scores:" << std::endl;
        for (const auto &m : mbo){
            std::cout << ((m.dir) ? "true":"false") << ", " << m.min_offset << ", " << m.max_offset << ", " << m.len << ", " << m.score << std::endl;
        }
    }

    auto prev_len = mbo.size()+1;

    while (mbo.size() < prev_len) {
        auto used = std::vector<bool>(mbo.size(), false);
        std::vector<match_band> new_mbo;

        for (int mi=0; mi < mbo.size(); mi++) {
            if (used[mi]){continue;}
            used[mi] = true;
            auto m = mbo[mi];
            for (int mi2 = 0; mi2 < mbo.size(); mi2++) {
                if (used[mi2]){continue;}
                auto m2 = mbo[mi2];
                if (m.min_offset<m2.max_offset and m2.min_offset < m.max_offset){
                    m.min_offset = std::min(m.min_offset,m2.min_offset);
                    m.max_offset = std::max(m.max_offset,m2.max_offset);
                    m.len += m2.len;
                    m.score += m2.score;
                    used[mi2] = true;
                }
            }
            new_mbo.emplace_back(m);
        }
        prev_len = mbo.size();
        mbo = new_mbo;
    }

    std::sort(mbo.begin(), mbo.end(), [](match_band &ma, match_band &mb){return ma.score > mb.score;});

    if (verbose){
        std::cout << "Consolidated orientations, offsets, lengths and scores:\n";
        for (const auto &m : mbo){
            std::cout << ((m.dir) ? "true":"false") << ", " << m.min_offset << ", " << m.max_offset << ", " << m.len << ", " << m.score << std::endl;
        }
    }

    std::vector<match_band> filtered_mbo;
    auto max_score = mbo[0].score;
    std::copy_if(mbo.begin(), mbo.end(), std::back_inserter(filtered_mbo), [max_score](match_band &m){ return m.score >= 0.5f*max_score; });

    if (verbose){
        std::cout << "Filtered orientations, offsets, lengths and scores:\n";
        for (const auto &m : filtered_mbo){
            std::cout << ((m.dir) ? "true":"false") << ", " << m.min_offset << ", " << m.max_offset << ", " << m.len << ", " << m.score << std::endl;
        }
    }

    // Create matches min, max positions for each band that has passed the filter
    std::vector<LongReadMapping> filtered_matches;

    for (const auto &mb : filtered_mbo) {
        LongReadMapping chained;
        chained.nStart=INT32_MAX;
        chained.nEnd=INT32_MIN;
        chained.score=0;
        chained.read_id=matches[0].read_id;
        chained.node=mb.dir ? std::abs(matches[0].node) : -std::abs(matches[0].node);
        for (const auto &m : matches) {
            if ((m.qStart - m.nStart) >= mb.min_offset and (m.qEnd - m.nEnd) <= mb.max_offset) {
                if (chained.nStart>m.nStart){
                    chained.nStart=m.nStart;
                    chained.qStart=m.qStart;
                }
                if (chained.nEnd<m.nEnd){
                    chained.nEnd=m.nEnd;
                    chained.qEnd=m.qEnd;
                }
                chained.score+=m.score;
            }
        }
        filtered_matches.emplace_back(chained);
    }

    if (verbose){
        std::cout<<"Filtered matches:" << std::endl;
        for (const auto &m : filtered_matches)
            std::cout << m << std::endl;
    }

    return filtered_matches;
}